

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall ImPool<ImGuiTabBar>::~ImPool(ImPool<ImGuiTabBar> *this)

{
  Clear(this);
  ImVector<ImGuiStorage::ImGuiStoragePair>::~ImVector(&(this->Map).Data);
  ImVector<ImGuiTabBar>::~ImVector(&this->Data);
  return;
}

Assistant:

~ImPool()   { Clear(); }